

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmYield(LlvmCompilationContext *ctx,ExprYield *node)

{
  uint index;
  TypeBase *valueType;
  LLVMValueRef pLVar1;
  TypeBase *valueType_00;
  
  pLVar1 = CompileLlvm(ctx,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  index = ctx->currentNextRestoreBlock;
  ctx->currentNextRestoreBlock = index + 1;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[](&ctx->currentRestoreBlocks,index);
  valueType = node->value->type;
  if (valueType != ctx->ctx->typeVoid) {
    valueType_00 = GetStackType(ctx,valueType);
    ConvertToDataType(ctx,pLVar1,valueType_00,valueType);
  }
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmYield(LlvmCompilationContext &ctx, ExprYield *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	if(node->coroutineStateUpdate)
		CompileLlvm(ctx, node->coroutineStateUpdate);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	LLVMBasicBlockRef block = ctx.currentRestoreBlocks[ctx.currentNextRestoreBlock++];

	if(node->value->type == ctx.ctx.typeVoid)
	{
		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		value = ConvertToDataType(ctx, value, GetStackType(ctx, node->value->type), node->value->type);

		if(IsStructReturnType(ctx.currentFunctionSource->type->returnType))
		{
			LLVMBuildStore(ctx.builder, value, LLVMGetParam(ctx.currentFunction, 0));

			LLVMBuildRetVoid(ctx.builder);
		}
		else
		{
			LLVMBuildRet(ctx.builder, value);
		}
	}

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	return CheckType(ctx, node, NULL);
}